

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O3

void Ses_ManCleanLight(Ses_Man_t *pSes)

{
  word *pwVar1;
  word *pwVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  word *pwVar6;
  int *piVar7;
  Vec_Int_t *pVVar8;
  uint uVar9;
  uint uVar10;
  word wVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  
  iVar4 = pSes->nSpecFunc;
  if (0 < (long)iVar4) {
    uVar5 = pSes->bSpecInv;
    iVar12 = 0;
    lVar13 = 0;
    do {
      if ((uVar5 >> ((uint)lVar13 & 0x1f) & 1) != 0) {
        pwVar6 = pSes->pSpec;
        lVar14 = 0;
        do {
          pwVar1 = pwVar6 + iVar12 + lVar14;
          uVar9 = *(uint *)((long)pwVar1 + 4);
          wVar11 = pwVar1[1];
          uVar10 = *(uint *)((long)pwVar1 + 0xc);
          pwVar2 = pwVar6 + iVar12 + lVar14;
          *(uint *)pwVar2 = (uint)*pwVar1 ^ 0xffffffff;
          *(uint *)((long)pwVar2 + 4) = uVar9 ^ 0xffffffff;
          *(uint *)(pwVar2 + 1) = (uint)wVar11 ^ 0xffffffff;
          *(uint *)((long)pwVar2 + 0xc) = uVar10 ^ 0xffffffff;
          lVar14 = lVar14 + 2;
        } while (lVar14 != 4);
      }
      lVar13 = lVar13 + 1;
      iVar12 = iVar12 + 4;
    } while (lVar13 != iVar4);
  }
  piVar7 = pSes->pArrTimeProfile;
  if ((piVar7 != (int *)0x0) && (0 < pSes->nSpecVars)) {
    lVar13 = 0;
    do {
      piVar3 = piVar7 + lVar13;
      *piVar3 = *piVar3 + pSes->nArrTimeDelta;
      lVar13 = lVar13 + 1;
    } while (lVar13 < pSes->nSpecVars);
  }
  pVVar8 = pSes->vPolar;
  piVar7 = pVVar8->pArray;
  if (piVar7 != (int *)0x0) {
    free(piVar7);
  }
  free(pVVar8);
  pVVar8 = pSes->vAssump;
  piVar7 = pVVar8->pArray;
  if (piVar7 != (int *)0x0) {
    free(piVar7);
  }
  free(pVVar8);
  pVVar8 = pSes->vStairDecVars;
  piVar7 = pVVar8->pArray;
  if (piVar7 != (int *)0x0) {
    free(piVar7);
  }
  free(pVVar8);
  free(pSes);
  return;
}

Assistant:

static inline void Ses_ManCleanLight( Ses_Man_t * pSes )
{
    int h, i;
    for ( h = 0; h < pSes->nSpecFunc; ++h )
        if ( ( pSes->bSpecInv >> h ) & 1 )
            for ( i = 0; i < 4; ++i )
                pSes->pSpec[(h << 2) + i] = ~( pSes->pSpec[(h << 2) + i] );

    if ( pSes->pArrTimeProfile )
        for ( i = 0; i < pSes->nSpecVars; ++i )
            pSes->pArrTimeProfile[i] += pSes->nArrTimeDelta;

    Vec_IntFree( pSes->vPolar );
    Vec_IntFree( pSes->vAssump );
    Vec_IntFree( pSes->vStairDecVars );

    ABC_FREE( pSes );
}